

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEvaluator.cpp
# Opt level: O1

void __thiscall simpleExpressionEvaluator::ExpressionEvaluator::_parse(ExpressionEvaluator *this)

{
  ostream *poVar1;
  long *plVar2;
  undefined8 extraout_RAX;
  ExpressionEvaluator *this_00;
  double dVar3;
  _Alloc_hider local_30;
  undefined8 local_20;
  
  dVar3 = _expr(this);
  if (this->_token == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The result is : ",0x10);
    poVar1 = std::ostream::_M_insert<double>(dVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    plVar2 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    return;
  }
  this_00 = (ExpressionEvaluator *)&stack0xffffffffffffffd0;
  local_30._M_p = (pointer)&stack0xffffffffffffffe0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffffd0,"Tokens after end of expression.","");
  _error(this_00,(string *)&stack0xffffffffffffffd0);
  if (local_30._M_p != (pointer)&stack0xffffffffffffffe0) {
    operator_delete(local_30._M_p,local_20 + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ExpressionEvaluator::_parse()
{
	/* parse -> expr '\n' */

	auto result = _expr();
	if (_token == '\0')
		cout << "The result is : " << result << endl << endl;
	else
		_error("Tokens after end of expression.");
}